

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHTTP.cpp
# Opt level: O3

size_t __thiscall adios2::transport::FileHTTP::GetSize(FileHTTP *this)

{
  bool bVar1;
  uint uVar2;
  uint __val;
  int iVar3;
  long *plVar4;
  ssize_t sVar5;
  uint uVar6;
  size_type *psVar7;
  uint __len;
  string __str;
  char buffer [128];
  char request [1024];
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  char *local_4d8 [2];
  char local_4c8 [16];
  char local_4b8 [1160];
  
  local_4b8[0x70] = '\0';
  local_4b8[0x71] = '\0';
  local_4b8[0x72] = '\0';
  local_4b8[0x73] = '\0';
  local_4b8[0x74] = '\0';
  local_4b8[0x75] = '\0';
  local_4b8[0x76] = '\0';
  local_4b8[0x77] = '\0';
  local_4b8[0x78] = '\0';
  local_4b8[0x79] = '\0';
  local_4b8[0x7a] = '\0';
  local_4b8[0x7b] = '\0';
  local_4b8[0x7c] = '\0';
  local_4b8[0x7d] = '\0';
  local_4b8[0x7e] = '\0';
  local_4b8[0x7f] = '\0';
  local_4b8[0x60] = '\0';
  local_4b8[0x61] = '\0';
  local_4b8[0x62] = '\0';
  local_4b8[99] = '\0';
  local_4b8[100] = '\0';
  local_4b8[0x65] = '\0';
  local_4b8[0x66] = '\0';
  local_4b8[0x67] = '\0';
  local_4b8[0x68] = '\0';
  local_4b8[0x69] = '\0';
  local_4b8[0x6a] = '\0';
  local_4b8[0x6b] = '\0';
  local_4b8[0x6c] = '\0';
  local_4b8[0x6d] = '\0';
  local_4b8[0x6e] = '\0';
  local_4b8[0x6f] = '\0';
  local_4b8[0x50] = '\0';
  local_4b8[0x51] = '\0';
  local_4b8[0x52] = '\0';
  local_4b8[0x53] = '\0';
  local_4b8[0x54] = '\0';
  local_4b8[0x55] = '\0';
  local_4b8[0x56] = '\0';
  local_4b8[0x57] = '\0';
  local_4b8[0x58] = '\0';
  local_4b8[0x59] = '\0';
  local_4b8[0x5a] = '\0';
  local_4b8[0x5b] = '\0';
  local_4b8[0x5c] = '\0';
  local_4b8[0x5d] = '\0';
  local_4b8[0x5e] = '\0';
  local_4b8[0x5f] = '\0';
  local_4b8[0x40] = '\0';
  local_4b8[0x41] = '\0';
  local_4b8[0x42] = '\0';
  local_4b8[0x43] = '\0';
  local_4b8[0x44] = '\0';
  local_4b8[0x45] = '\0';
  local_4b8[0x46] = '\0';
  local_4b8[0x47] = '\0';
  local_4b8[0x48] = '\0';
  local_4b8[0x49] = '\0';
  local_4b8[0x4a] = '\0';
  local_4b8[0x4b] = '\0';
  local_4b8[0x4c] = '\0';
  local_4b8[0x4d] = '\0';
  local_4b8[0x4e] = '\0';
  local_4b8[0x4f] = '\0';
  local_4b8[0x30] = '\0';
  local_4b8[0x31] = '\0';
  local_4b8[0x32] = '\0';
  local_4b8[0x33] = '\0';
  local_4b8[0x34] = '\0';
  local_4b8[0x35] = '\0';
  local_4b8[0x36] = '\0';
  local_4b8[0x37] = '\0';
  local_4b8[0x38] = '\0';
  local_4b8[0x39] = '\0';
  local_4b8[0x3a] = '\0';
  local_4b8[0x3b] = '\0';
  local_4b8[0x3c] = '\0';
  local_4b8[0x3d] = '\0';
  local_4b8[0x3e] = '\0';
  local_4b8[0x3f] = '\0';
  local_4b8[0x20] = '\0';
  local_4b8[0x21] = '\0';
  local_4b8[0x22] = '\0';
  local_4b8[0x23] = '\0';
  local_4b8[0x24] = '\0';
  local_4b8[0x25] = '\0';
  local_4b8[0x26] = '\0';
  local_4b8[0x27] = '\0';
  local_4b8[0x28] = '\0';
  local_4b8[0x29] = '\0';
  local_4b8[0x2a] = '\0';
  local_4b8[0x2b] = '\0';
  local_4b8[0x2c] = '\0';
  local_4b8[0x2d] = '\0';
  local_4b8[0x2e] = '\0';
  local_4b8[0x2f] = '\0';
  local_4b8[0x10] = '\0';
  local_4b8[0x11] = '\0';
  local_4b8[0x12] = '\0';
  local_4b8[0x13] = '\0';
  local_4b8[0x14] = '\0';
  local_4b8[0x15] = '\0';
  local_4b8[0x16] = '\0';
  local_4b8[0x17] = '\0';
  local_4b8[0x18] = '\0';
  local_4b8[0x19] = '\0';
  local_4b8[0x1a] = '\0';
  local_4b8[0x1b] = '\0';
  local_4b8[0x1c] = '\0';
  local_4b8[0x1d] = '\0';
  local_4b8[0x1e] = '\0';
  local_4b8[0x1f] = '\0';
  local_4b8[0] = '\0';
  local_4b8[1] = '\0';
  local_4b8[2] = '\0';
  local_4b8[3] = '\0';
  local_4b8[4] = '\0';
  local_4b8[5] = '\0';
  local_4b8[6] = '\0';
  local_4b8[7] = '\0';
  local_4b8[8] = '\0';
  local_4b8[9] = '\0';
  local_4b8[10] = '\0';
  local_4b8[0xb] = '\0';
  local_4b8[0xc] = '\0';
  local_4b8[0xd] = '\0';
  local_4b8[0xe] = '\0';
  local_4b8[0xf] = '\0';
  __val = snprintf(local_4b8 + 0x80,0x400,
                   "GET %s HTTP/1.1\r\nHost: %s\r\nContent-Length: bytes\r\n\r\n",
                   (this->super_Transport).m_Name._M_dataplus._M_p,
                   (this->m_hostname)._M_dataplus._M_p);
  if (0x3ff < (int)__val) {
    local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"Toolkit","");
    local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_558,"transport::file::FileHTTP","");
    local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"GetSize","");
    uVar6 = __val;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_0064d284;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_0064d284;
      }
      if (uVar6 < 10000) goto LAB_0064d284;
      bVar1 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar2 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
LAB_0064d284:
    local_4d8[0] = local_4c8;
    std::__cxx11::string::_M_construct((ulong)local_4d8,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_4d8[0],__len,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_4d8,0,(char *)0x0,0x750562);
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_518.field_2._M_allocated_capacity = *psVar7;
      local_518.field_2._8_8_ = plVar4[3];
      local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
    }
    else {
      local_518.field_2._M_allocated_capacity = *psVar7;
      local_518._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_518._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_538,&local_558,&local_4f8,&local_518,-1)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p);
    }
    if (local_4d8[0] != local_4c8) {
      operator_delete(local_4d8[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != &local_558.field_2) {
      operator_delete(local_558._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p);
    }
  }
  iVar3 = socket(2,1,this->m_p_proto);
  this->m_socketFileDescriptor = iVar3;
  if (iVar3 == -1) {
    local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"Toolkit","");
    local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_558,"transport::file::FileHTTP","");
    local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"GetSize","");
    local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"cannot bind socket","");
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_538,&local_558,&local_4f8,&local_518,-1)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != &local_558.field_2) {
      operator_delete(local_558._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p);
    }
    iVar3 = this->m_socketFileDescriptor;
  }
  iVar3 = connect(iVar3,(sockaddr *)&this->sockaddr_in,0x10);
  if (iVar3 == -1) {
    local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"Toolkit","");
    local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_558,"transport::file::FileHTTP","");
    local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"GetSize","");
    local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"cannot connect","");
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_538,&local_558,&local_4f8,&local_518,-1)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != &local_558.field_2) {
      operator_delete(local_558._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p);
    }
  }
  if (0 < (int)__val) {
    iVar3 = 0;
    do {
      sVar5 = write(this->m_socketFileDescriptor,local_4b8 + (long)iVar3 + 0x80,
                    (long)(int)(__val - iVar3));
      if ((int)sVar5 == -1) {
        local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"Toolkit","");
        local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_558,"transport::file::FileHTTP","");
        local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"GetSize","");
        local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_518,"sending request failed","");
        helper::Throw<std::ios_base::failure[abi:cxx11]>
                  (&local_538,&local_558,&local_4f8,&local_518,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
          operator_delete(local_4f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._M_dataplus._M_p != &local_558.field_2) {
          operator_delete(local_558._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          operator_delete(local_538._M_dataplus._M_p);
        }
      }
      iVar3 = iVar3 + (int)sVar5;
    } while (iVar3 < (int)__val);
  }
  do {
    sVar5 = read(this->m_socketFileDescriptor,local_4b8,0x80);
  } while (0 < (int)sVar5);
  if ((int)sVar5 == -1) {
    local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"Toolkit","");
    local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_558,"transport::file::FileHTTP","");
    local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"GetSize","");
    local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_518,"receiving response failed","");
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_538,&local_558,&local_4f8,&local_518,-1)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != &local_558.field_2) {
      operator_delete(local_558._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p);
    }
  }
  close(this->m_socketFileDescriptor);
  iVar3 = atoi(local_4b8);
  return (long)iVar3;
}

Assistant:

size_t FileHTTP::GetSize()
{
    char request_template[] = "GET %s HTTP/1.1\r\nHost: %s\r\nContent-Length: bytes\r\n\r\n";
    enum CONSTEXPR
    {
        MAX_REQUEST_LEN = 1024,
        BUF_SIZE = 128
    };
    char request[MAX_REQUEST_LEN];
    char buffer[BUF_SIZE] = {'\0'};
    int request_len =
        snprintf(request, MAX_REQUEST_LEN, request_template, m_Name.c_str(), m_hostname.c_str());
    if (request_len >= MAX_REQUEST_LEN)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "GetSize",
                                              "request length too long:  " +
                                                  std::to_string(request_len));
    }
    m_socketFileDescriptor = socket(AF_INET, SOCK_STREAM, m_p_proto);
    if (m_socketFileDescriptor == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "GetSize",
                                              "cannot bind socket");
    }
    /* Actually connect. */
    if (connect(m_socketFileDescriptor, (struct sockaddr *)&sockaddr_in, sizeof(sockaddr_in)) == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "GetSize",
                                              "cannot connect");
    }
    /* Send HTTP request. */
    int nbytes_total = 0;
    while (nbytes_total < request_len)
    {
        int nbytes_last =
            write(m_socketFileDescriptor, request + nbytes_total, request_len - nbytes_total);
        if (nbytes_last == -1)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "GetSize",
                                                  "sending request failed");
        }
        nbytes_total += nbytes_last;
    }

    /* Read the response. */
    while ((nbytes_total = read(m_socketFileDescriptor, buffer, BUF_SIZE)) > 0)
        ;
    if (nbytes_total == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "GetSize",
                                              "receiving response failed");
    }
    close(m_socketFileDescriptor);
    size_t result = atoi(buffer);

    return result;
}